

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O0

void __thiscall EDColor::MyRGB2LabFast(EDColor *this)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int local_ac;
  int local_a8;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  double scale;
  double dStack_88;
  int i_1;
  double max;
  double min;
  double refZ;
  double refY;
  double refX;
  int i;
  double *b;
  double *a;
  double *L;
  double z;
  double y;
  double x;
  double blue;
  double green;
  double red;
  EDColor *this_local;
  
  if (!LUT_Initialized) {
    InitColorEDLib();
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(this->width * this->height);
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(this->width * this->height);
  uVar6 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(this->width * this->height);
  uVar6 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar6);
  for (refX._4_4_ = 0; refX._4_4_ < this->width * this->height; refX._4_4_ = refX._4_4_ + 1) {
    dVar10 = LUT1[(int)(((double)this->redImg[refX._4_4_] / 255.0) * 4194304.0 + 0.5)] * 100.0;
    dVar11 = LUT1[(int)(((double)this->greenImg[refX._4_4_] / 255.0) * 4194304.0 + 0.5)] * 100.0;
    dVar12 = LUT1[(int)(((double)this->blueImg[refX._4_4_] / 255.0) * 4194304.0 + 0.5)] * 100.0;
    dVar1 = LUT2[(int)(((dVar12 * 0.1804375 + dVar10 * 0.4124564 + dVar11 * 0.3575761) / 95.047) *
                       4194304.0 + 0.5)];
    dVar2 = LUT2[(int)(((dVar12 * 0.072175 + dVar10 * 0.2126729 + dVar11 * 0.7151522) / 100.0) *
                       4194304.0 + 0.5)];
    dVar10 = LUT2[(int)(((dVar12 * 0.9503041 + dVar10 * 0.0193339 + dVar11 * 0.119192) / 108.883) *
                        4194304.0 + 0.5)];
    *(double *)((long)pvVar7 + (long)refX._4_4_ * 8) = dVar2 * 116.0 + -16.0;
    *(double *)((long)pvVar8 + (long)refX._4_4_ * 8) = (dVar1 / dVar2) * 500.0;
    *(double *)((long)pvVar9 + (long)refX._4_4_ * 8) = (dVar2 - dVar10) * 200.0;
  }
  max = 10000000000.0;
  dStack_88 = -10000000000.0;
  for (scale._4_4_ = 0; scale._4_4_ < this->width * this->height; scale._4_4_ = scale._4_4_ + 1) {
    if (max <= *(double *)((long)pvVar7 + (long)scale._4_4_ * 8)) {
      if (dStack_88 < *(double *)((long)pvVar7 + (long)scale._4_4_ * 8)) {
        dStack_88 = *(double *)((long)pvVar7 + (long)scale._4_4_ * 8);
      }
    }
    else {
      max = *(double *)((long)pvVar7 + (long)scale._4_4_ * 8);
    }
  }
  for (i_4 = 0; i_4 < this->width * this->height; i_4 = i_4 + 1) {
    this->L_Img[i_4] =
         (uchar)(int)((*(double *)((long)pvVar7 + (long)i_4 * 8) - max) *
                     (255.0 / (dStack_88 - max)));
  }
  max = 10000000000.0;
  dStack_88 = -10000000000.0;
  for (i_5 = 0; i_5 < this->width * this->height; i_5 = i_5 + 1) {
    if (max <= *(double *)((long)pvVar8 + (long)i_5 * 8)) {
      if (dStack_88 < *(double *)((long)pvVar8 + (long)i_5 * 8)) {
        dStack_88 = *(double *)((long)pvVar8 + (long)i_5 * 8);
      }
    }
    else {
      max = *(double *)((long)pvVar8 + (long)i_5 * 8);
    }
  }
  for (i_6 = 0; i_6 < this->width * this->height; i_6 = i_6 + 1) {
    this->a_Img[i_6] =
         (uchar)(int)((*(double *)((long)pvVar8 + (long)i_6 * 8) - max) *
                     (255.0 / (dStack_88 - max)));
  }
  max = 10000000000.0;
  dStack_88 = -10000000000.0;
  for (local_a8 = 0; local_a8 < this->width * this->height; local_a8 = local_a8 + 1) {
    if (max <= *(double *)((long)pvVar9 + (long)local_a8 * 8)) {
      if (dStack_88 < *(double *)((long)pvVar9 + (long)local_a8 * 8)) {
        dStack_88 = *(double *)((long)pvVar9 + (long)local_a8 * 8);
      }
    }
    else {
      max = *(double *)((long)pvVar9 + (long)local_a8 * 8);
    }
  }
  for (local_ac = 0; local_ac < this->width * this->height; local_ac = local_ac + 1) {
    this->b_Img[local_ac] =
         (uchar)(int)((*(double *)((long)pvVar9 + (long)local_ac * 8) - max) *
                     (255.0 / (dStack_88 - max)));
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  if (pvVar8 != (void *)0x0) {
    operator_delete__(pvVar8);
  }
  if (pvVar9 != (void *)0x0) {
    operator_delete__(pvVar9);
  }
  return;
}

Assistant:

void EDColor::MyRGB2LabFast()
{
	// Inialize LUTs if necessary
	if (!LUT_Initialized) 
		InitColorEDLib();

	// First RGB 2 XYZ
	double red, green, blue;
	double x, y, z;

	// Space for temp. allocation
	double *L = new double[width*height];
	double *a = new double[width*height];
	double *b = new double[width*height];

	for (int i = 0; i<width*height; i++) {
		red = redImg[i] / 255.0;
		green = greenImg[i] / 255.0;
		blue = blueImg[i] / 255.0;

		red = LUT1[(int)(red*LUT_SIZE + 0.5)];
		green = LUT1[(int)(green*LUT_SIZE + 0.5)];
		blue = LUT1[(int)(blue*LUT_SIZE + 0.5)];

		red = red * 100;
		green = green * 100;
		blue = blue * 100;

		//Observer. = 2°, Illuminant = D65
		x = red*0.4124564 + green*0.3575761 + blue*0.1804375;
		y = red*0.2126729 + green*0.7151522 + blue*0.0721750;
		z = red*0.0193339 + green*0.1191920 + blue*0.9503041;

		// Now xyz 2 Lab
		double refX = 95.047;
		double refY = 100.000;
		double refZ = 108.883;

		x = x / refX;          //ref_X =  95.047   Observer= 2°, Illuminant= D65
		y = y / refY;          //ref_Y = 100.000
		z = z / refZ;          //ref_Z = 108.883

		x = LUT2[(int)(x*LUT_SIZE + 0.5)];
		y = LUT2[(int)(y*LUT_SIZE + 0.5)];
		z = LUT2[(int)(z*LUT_SIZE + 0.5)];

		L[i] = (116.0*y) - 16;
		a[i] = 500 * (x / y);
		b[i] = 200 * (y - z);
	} //end-for
	
	// Scale L to [0-255]
	double min = 1e10;
	double max = -1e10;
	for (int i = 0; i<width*height; i++) {
		if (L[i]<min) min = L[i];
		else if (L[i]>max) max = L[i];
	} //end-for

	double scale = 255.0 / (max - min);
	for (int i = 0; i<width*height; i++) { L_Img[i] = (unsigned char)((L[i] - min)*scale); }

	// Scale a to [0-255]
	min = 1e10;
	max = -1e10;
	for (int i = 0; i<width*height; i++) {
		if (a[i]<min) min = a[i];
		else if (a[i]>max) max = a[i];
	} //end-for

	scale = 255.0 / (max - min);
	for (int i = 0; i<width*height; i++) { a_Img[i] = (unsigned char)((a[i] - min)*scale); }

	// Scale b to [0-255]
	min = 1e10;
	max = -1e10;
	for (int i = 0; i<width*height; i++) {
		if (b[i]<min) min = b[i];
		else if (b[i]>max) max = b[i];
	} //end-for

	scale = 255.0 / (max - min);
	for (int i = 0; i<width*height; i++) { b_Img[i] = (unsigned char)((b[i] - min)*scale); }

									   
	// clean space
	delete[] L;
	delete[] a;
	delete[] b;
}